

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O0

void __thiscall
dlib::input_rgb_image::
to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (input_rgb_image *this,
          __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
          ibegin,__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                 iend,resizable_tensor *data)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  difference_type dVar5;
  ostream *poVar6;
  undefined8 uVar7;
  long lVar8;
  ostream *poVar9;
  string *a;
  rgb_pixel *prVar10;
  longlong lVar11;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_RCX;
  undefined8 in_RDX;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_RSI;
  float *in_RDI;
  float *p;
  rgb_pixel temp;
  long c;
  long r;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  i_1;
  float *ptr;
  size_t offset;
  ostringstream dlib_o_out_1;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  i;
  long nc;
  long nr;
  ostringstream dlib_o_out;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  *in_stack_fffffffffffffaf8;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_stack_fffffffffffffb00;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_fffffffffffffb08;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  nr_;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_fffffffffffffb10;
  longlong in_stack_fffffffffffffb18;
  error_type eVar12;
  resizable_tensor *in_stack_fffffffffffffb20;
  byte local_3d3;
  byte bStack_3d2;
  long local_3d0;
  long local_3c8;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  local_3c0;
  float *local_3b8;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_3b0;
  undefined8 local_3a8;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_3a0;
  undefined1 local_391;
  ostringstream local_370 [376];
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  local_1f8;
  long local_1f0;
  long local_1e8;
  undefined1 local_1d9;
  ostringstream local_1a8 [392];
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  local_20;
  undefined8 local_10;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  local_8;
  
  local_20._M_current = in_RCX;
  local_10 = in_RDX;
  local_8._M_current = in_RSI;
  dVar5 = std::
          distance<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
                    (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  if (dVar5 < 1) {
    dlib_assert_breakpoint();
    eVar12 = (error_type)((ulong)in_stack_fffffffffffffb18 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"\n\nError detected at line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x50);
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)local_1a8,"Error detected in file ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/input.h"
                            );
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)local_1a8,"Error detected in function ");
    poVar6 = std::operator<<(poVar6,
                             "void dlib::input_rgb_image::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
                            );
    std::operator<<(poVar6,".\n\n");
    poVar6 = std::operator<<((ostream *)local_1a8,"Failing expression was ");
    poVar6 = std::operator<<(poVar6,"std::distance(ibegin,iend) > 0");
    std::operator<<(poVar6,".\n");
    poVar6 = (ostream *)std::ostream::operator<<(local_1a8,std::boolalpha);
    poVar6 = std::operator<<(poVar6,"");
    std::operator<<(poVar6,"\n");
    local_1d9 = 1;
    uVar7 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffffb20,eVar12,
               (string *)in_stack_fffffffffffffb10._M_current);
    local_1d9 = 0;
    __cxa_throw(uVar7,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  __gnu_cxx::
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  ::operator->(&local_8);
  local_1e8 = matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
              ::nr((matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    *)0x1422cc);
  __gnu_cxx::
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  ::operator->(&local_8);
  local_1f0 = matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
              ::nc((matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    *)0x1422e9);
  local_1f8._M_current = local_8._M_current;
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                        *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    if (!bVar4) {
      local_3a0 = local_8._M_current;
      local_3a8 = local_10;
      nr_._M_current = local_20._M_current;
      std::
      distance<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
                (in_stack_fffffffffffffb10,local_20);
      resizable_tensor::set_size
                (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                 (longlong)in_stack_fffffffffffffb10._M_current,(longlong)nr_._M_current,
                 (longlong)in_stack_fffffffffffffb00);
      local_3b0 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                   *)(local_1e8 * local_1f0);
      local_3b8 = (float *)(**(code **)(((local_20._M_current)->data).data + 8))();
      local_3c0._M_current = local_8._M_current;
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                            *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        if (!bVar4) break;
        for (local_3c8 = 0; local_3c8 < local_1e8; local_3c8 = local_3c8 + 1) {
          for (local_3d0 = 0; local_3d0 < local_1f0; local_3d0 = local_3d0 + 1) {
            __gnu_cxx::
            __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
            ::operator*(&local_3c0);
            prVar10 = matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                      ::operator()(in_stack_fffffffffffffb00,(long)in_stack_fffffffffffffaf8,
                                   0x14281e);
            uVar2 = prVar10->red;
            uVar3 = prVar10->green;
            bVar1 = prVar10->blue;
            *local_3b8 = ((float)(byte)uVar2 - *in_RDI) / 256.0;
            local_3b8[(long)local_3b0] = ((float)(byte)uVar3 - in_RDI[1]) / 256.0;
            (local_3b8 + (long)local_3b0)[(long)local_3b0] = ((float)bVar1 - in_RDI[2]) / 256.0;
            local_3b8 = local_3b8 + 1;
          }
        }
        in_stack_fffffffffffffb00 = local_3b0;
        lVar11 = tensor::k((tensor *)local_20._M_current);
        local_3b8 = local_3b8 + (long)in_stack_fffffffffffffb00 * (lVar11 + -1);
        __gnu_cxx::
        __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
        ::operator++(&local_3c0);
      }
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
    ::operator->(&local_1f8);
    lVar8 = matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
            ::nr((matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  *)0x142334);
    if (lVar8 != local_1e8) break;
    __gnu_cxx::
    __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
    ::operator->(&local_1f8);
    lVar8 = matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
            ::nc((matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  *)0x142353);
    if (lVar8 != local_1f0) break;
    __gnu_cxx::
    __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
    ::operator++(&local_1f8);
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_370);
  poVar6 = std::operator<<((ostream *)local_370,"\n\nError detected at line ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5d);
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<((ostream *)local_370,"Error detected in file ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/input.h"
                          );
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<((ostream *)local_370,"Error detected in function ");
  poVar6 = std::operator<<(poVar6,
                           "void dlib::input_rgb_image::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
                          );
  std::operator<<(poVar6,".\n\n");
  poVar6 = std::operator<<((ostream *)local_370,"Failing expression was ");
  poVar6 = std::operator<<(poVar6,"i->nr()==nr && i->nc()==nc");
  std::operator<<(poVar6,".\n");
  poVar6 = (ostream *)std::ostream::operator<<(local_370,std::boolalpha);
  poVar6 = std::operator<<(poVar6,"\t input_rgb_image::to_tensor()");
  poVar6 = std::operator<<(poVar6,
                           "\n\t All matrices given to to_tensor() must have the same dimensions.");
  poVar6 = std::operator<<(poVar6,"\n\t nr: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1e8);
  poVar6 = std::operator<<(poVar6,"\n\t nc: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1f0);
  poVar6 = std::operator<<(poVar6,"\n\t i->nr(): ");
  __gnu_cxx::
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  ::operator->(&local_1f8);
  lVar8 = matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ::nr((matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)0x142595);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,lVar8);
  poVar6 = std::operator<<(poVar6,"\n\t i->nc(): ");
  __gnu_cxx::
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  ::operator->(&local_1f8);
  lVar8 = matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ::nc((matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)0x1425d6);
  poVar9 = (ostream *)std::ostream::operator<<(poVar6,lVar8);
  std::operator<<(poVar9,"\n");
  eVar12 = (error_type)((ulong)poVar9 >> 0x20);
  local_391 = 1;
  a = (string *)__cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar6,eVar12,a);
  local_391 = 0;
  __cxa_throw(a,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void to_tensor (
            forward_iterator ibegin,
            forward_iterator iend,
            resizable_tensor& data
        ) const
        {
            DLIB_CASSERT(std::distance(ibegin,iend) > 0);
            const auto nr = ibegin->nr();
            const auto nc = ibegin->nc();
            // make sure all the input matrices have the same dimensions
            for (auto i = ibegin; i != iend; ++i)
            {
                DLIB_CASSERT(i->nr()==nr && i->nc()==nc,
                    "\t input_rgb_image::to_tensor()"
                    << "\n\t All matrices given to to_tensor() must have the same dimensions."
                    << "\n\t nr: " << nr
                    << "\n\t nc: " << nc
                    << "\n\t i->nr(): " << i->nr()
                    << "\n\t i->nc(): " << i->nc()
                );
            }


            // initialize data to the right size to contain the stuff in the iterator range.
            data.set_size(std::distance(ibegin,iend), 3, nr, nc);


            const size_t offset = nr*nc;
            auto ptr = data.host();
            for (auto i = ibegin; i != iend; ++i)
            {
                for (long r = 0; r < nr; ++r)
                {
                    for (long c = 0; c < nc; ++c)
                    {
                        rgb_pixel temp = (*i)(r,c);
                        auto p = ptr++;
                        *p = (temp.red-avg_red)/256.0; 
                        p += offset;
                        *p = (temp.green-avg_green)/256.0; 
                        p += offset;
                        *p = (temp.blue-avg_blue)/256.0; 
                        p += offset;
                    }
                }
                ptr += offset*(data.k()-1);
            }

        }